

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

Quaternion<double> * __thiscall
OpenMD::SquareMatrix3<double>::toQuaternion(SquareMatrix3<double> *this)

{
  double *pdVar1;
  double *in_RSI;
  Vector<double,_4U> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double ad3;
  double ad2;
  double ad1;
  double s;
  double t;
  Quaternion<double> *q;
  
  Quaternion<double>::Quaternion((Quaternion<double> *)0x33ca0f);
  dVar2 = *in_RSI + in_RSI[4] + in_RSI[8] + 1.0;
  dVar3 = std::numeric_limits<double>::epsilon();
  if (dVar2 <= dVar3) {
    dVar2 = *in_RSI;
    dVar3 = in_RSI[4];
    if ((dVar2 < dVar3) || (dVar2 < in_RSI[8])) {
      if ((dVar3 < dVar2) || (dVar3 < in_RSI[8])) {
        dVar4 = sqrt(((in_RSI[8] + 1.0) - *in_RSI) - in_RSI[4]);
        dVar4 = 0.5 / dVar4;
        dVar2 = in_RSI[1];
        dVar3 = in_RSI[3];
        pdVar1 = Vector<double,_4U>::operator[](in_RDI,0);
        *pdVar1 = (dVar2 - dVar3) * dVar4;
        dVar2 = in_RSI[2];
        dVar3 = in_RSI[6];
        pdVar1 = Vector<double,_4U>::operator[](in_RDI,1);
        *pdVar1 = (dVar2 + dVar3) * dVar4;
        dVar2 = in_RSI[5];
        dVar3 = in_RSI[7];
        pdVar1 = Vector<double,_4U>::operator[](in_RDI,2);
        *pdVar1 = (dVar2 + dVar3) * dVar4;
        pdVar1 = Vector<double,_4U>::operator[](in_RDI,3);
        *pdVar1 = 0.25 / dVar4;
      }
      else {
        dVar4 = sqrt(((in_RSI[4] + 1.0) - *in_RSI) - in_RSI[8]);
        dVar4 = 0.5 / dVar4;
        dVar2 = in_RSI[6];
        dVar3 = in_RSI[2];
        pdVar1 = Vector<double,_4U>::operator[](in_RDI,0);
        *pdVar1 = (dVar2 - dVar3) * dVar4;
        dVar2 = in_RSI[1];
        dVar3 = in_RSI[3];
        pdVar1 = Vector<double,_4U>::operator[](in_RDI,1);
        *pdVar1 = (dVar2 + dVar3) * dVar4;
        pdVar1 = Vector<double,_4U>::operator[](in_RDI,2);
        *pdVar1 = 0.25 / dVar4;
        dVar2 = in_RSI[5];
        dVar3 = in_RSI[7];
        pdVar1 = Vector<double,_4U>::operator[](in_RDI,3);
        *pdVar1 = (dVar2 + dVar3) * dVar4;
      }
    }
    else {
      dVar4 = sqrt(((*in_RSI + 1.0) - in_RSI[4]) - in_RSI[8]);
      dVar4 = 0.5 / dVar4;
      dVar2 = in_RSI[5];
      dVar3 = in_RSI[7];
      pdVar1 = Vector<double,_4U>::operator[](in_RDI,0);
      *pdVar1 = (dVar2 - dVar3) * dVar4;
      pdVar1 = Vector<double,_4U>::operator[](in_RDI,1);
      *pdVar1 = 0.25 / dVar4;
      dVar2 = in_RSI[1];
      dVar3 = in_RSI[3];
      pdVar1 = Vector<double,_4U>::operator[](in_RDI,2);
      *pdVar1 = (dVar2 + dVar3) * dVar4;
      dVar2 = in_RSI[2];
      dVar3 = in_RSI[6];
      pdVar1 = Vector<double,_4U>::operator[](in_RDI,3);
      *pdVar1 = (dVar2 + dVar3) * dVar4;
    }
  }
  else {
    dVar4 = sqrt(dVar2);
    dVar4 = 0.5 / dVar4;
    pdVar1 = Vector<double,_4U>::operator[](in_RDI,0);
    *pdVar1 = 0.25 / dVar4;
    dVar2 = in_RSI[5];
    dVar3 = in_RSI[7];
    pdVar1 = Vector<double,_4U>::operator[](in_RDI,1);
    *pdVar1 = (dVar2 - dVar3) * dVar4;
    dVar2 = in_RSI[6];
    dVar3 = in_RSI[2];
    pdVar1 = Vector<double,_4U>::operator[](in_RDI,2);
    *pdVar1 = (dVar2 - dVar3) * dVar4;
    dVar2 = in_RSI[1];
    dVar3 = in_RSI[3];
    pdVar1 = Vector<double,_4U>::operator[](in_RDI,3);
    *pdVar1 = (dVar2 - dVar3) * dVar4;
  }
  return (Quaternion<double> *)in_RDI;
}

Assistant:

Quaternion<Real> toQuaternion() {
      Quaternion<Real> q;
      Real t, s;
      Real ad1, ad2, ad3;
      t = this->data_[0][0] + this->data_[1][1] + this->data_[2][2] + 1.0;

      if (t > std::numeric_limits<RealType>::epsilon()) {
        s    = 0.5 / sqrt(t);
        q[0] = 0.25 / s;
        q[1] = (this->data_[1][2] - this->data_[2][1]) * s;
        q[2] = (this->data_[2][0] - this->data_[0][2]) * s;
        q[3] = (this->data_[0][1] - this->data_[1][0]) * s;
      } else {
        ad1 = this->data_[0][0];
        ad2 = this->data_[1][1];
        ad3 = this->data_[2][2];

        if (ad1 >= ad2 && ad1 >= ad3) {
          s    = 0.5 / sqrt(1.0 + this->data_[0][0] - this->data_[1][1] -
                            this->data_[2][2]);
          q[0] = (this->data_[1][2] - this->data_[2][1]) * s;
          q[1] = 0.25 / s;
          q[2] = (this->data_[0][1] + this->data_[1][0]) * s;
          q[3] = (this->data_[0][2] + this->data_[2][0]) * s;
        } else if (ad2 >= ad1 && ad2 >= ad3) {
          s    = 0.5 / sqrt(1.0 + this->data_[1][1] - this->data_[0][0] -
                            this->data_[2][2]);
          q[0] = (this->data_[2][0] - this->data_[0][2]) * s;
          q[1] = (this->data_[0][1] + this->data_[1][0]) * s;
          q[2] = 0.25 / s;
          q[3] = (this->data_[1][2] + this->data_[2][1]) * s;
        } else {
          s    = 0.5 / sqrt(1.0 + this->data_[2][2] - this->data_[0][0] -
                            this->data_[1][1]);
          q[0] = (this->data_[0][1] - this->data_[1][0]) * s;
          q[1] = (this->data_[0][2] + this->data_[2][0]) * s;
          q[2] = (this->data_[1][2] + this->data_[2][1]) * s;
          q[3] = 0.25 / s;
        }
      }

      return q;
    }